

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

char * ERR_getErrorString(ERR_enum code)

{
  if ((int)code < 0x3c) {
    if ((int)code < 0x1e) {
      switch(code) {
      case ZSTD_error_prefix_unknown:
        return "Unknown frame descriptor";
      case ZSTD_error_prefix_unknown|ZSTD_error_GENERIC:
      case ZSTD_error_version_unsupported|ZSTD_error_GENERIC:
      case ZSTD_error_frameParameter_unsupported|ZSTD_error_GENERIC:
      case ZSTD_error_frameParameter_windowTooLarge|ZSTD_error_GENERIC:
      case 0x12:
      case 0x13:
      case ZSTD_error_corruption_detected|ZSTD_error_GENERIC:
        break;
      case ZSTD_error_version_unsupported:
        return "Version not supported";
      case ZSTD_error_frameParameter_unsupported:
        return "Unsupported frame parameter";
      case ZSTD_error_frameParameter_windowTooLarge:
        return "Frame requires too much memory for decoding";
      case ZSTD_error_corruption_detected:
        return "Corrupted block detected";
      case ZSTD_error_checksum_wrong:
        return "Restored data doesn\'t match checksum";
      default:
        if (code == ZSTD_error_no_error) {
          return "No error detected";
        }
        if (code == ZSTD_error_GENERIC) {
          return "Error (generic)";
        }
      }
    }
    else {
      switch(code) {
      case ZSTD_error_dictionary_corrupted:
        return "Dictionary is corrupted";
      case ZSTD_error_dictionary_wrong:
        return "Dictionary mismatch";
      case ZSTD_error_dictionaryCreation_failed:
        return "Cannot create Dictionary from provided samples";
      case ZSTD_error_parameter_unsupported:
        return "Unsupported parameter";
      case ZSTD_error_parameter_outOfBound:
        return "Parameter is out of bound";
      case ZSTD_error_tableLog_tooLarge:
        return "tableLog requires too much memory : unsupported";
      case ZSTD_error_maxSymbolValue_tooLarge:
        return "Unsupported max Symbol Value : too large";
      case ZSTD_error_maxSymbolValue_tooSmall:
        return "Specified maxSymbolValue is too small";
      }
    }
  }
  else {
    switch(code) {
    case ZSTD_error_stage_wrong:
      return "Operation not authorized at current processing stage";
    case ZSTD_error_stage_wrong|ZSTD_error_GENERIC:
    case ZSTD_error_init_missing|ZSTD_error_GENERIC:
    case ZSTD_error_memory_allocation|ZSTD_error_GENERIC:
    case ZSTD_error_workSpace_tooSmall|ZSTD_error_GENERIC:
    case 0x44:
    case 0x45:
    case ZSTD_error_dstSize_tooSmall|ZSTD_error_GENERIC:
    case ZSTD_error_srcSize_wrong|ZSTD_error_GENERIC:
      break;
    case ZSTD_error_init_missing:
      return "Context should be init first";
    case ZSTD_error_memory_allocation:
      return "Allocation error : not enough memory";
    case ZSTD_error_workSpace_tooSmall:
      return "workSpace buffer is not large enough";
    case ZSTD_error_dstSize_tooSmall:
      return "Destination buffer is too small";
    case ZSTD_error_srcSize_wrong:
      return "Src size is incorrect";
    case ZSTD_error_dstBuffer_null:
      return "Operation on NULL destination buffer";
    default:
      if (code == ZSTD_error_frameIndex_tooLarge) {
        return "Frame index is too large";
      }
      if (code == ZSTD_error_seekableIO) {
        return "An I/O error occurred when reading/seeking";
      }
    }
  }
  return "Unspecified error code";
}

Assistant:

const char* ERR_getErrorString(ERR_enum code)
{
#ifdef ZSTD_STRIP_ERROR_STRINGS
    (void)code;
    return "Error strings stripped";
#else
    static const char* const notErrorCode = "Unspecified error code";
    switch( code )
    {
    case PREFIX(no_error): return "No error detected";
    case PREFIX(GENERIC):  return "Error (generic)";
    case PREFIX(prefix_unknown): return "Unknown frame descriptor";
    case PREFIX(version_unsupported): return "Version not supported";
    case PREFIX(frameParameter_unsupported): return "Unsupported frame parameter";
    case PREFIX(frameParameter_windowTooLarge): return "Frame requires too much memory for decoding";
    case PREFIX(corruption_detected): return "Corrupted block detected";
    case PREFIX(checksum_wrong): return "Restored data doesn't match checksum";
    case PREFIX(parameter_unsupported): return "Unsupported parameter";
    case PREFIX(parameter_outOfBound): return "Parameter is out of bound";
    case PREFIX(init_missing): return "Context should be init first";
    case PREFIX(memory_allocation): return "Allocation error : not enough memory";
    case PREFIX(workSpace_tooSmall): return "workSpace buffer is not large enough";
    case PREFIX(stage_wrong): return "Operation not authorized at current processing stage";
    case PREFIX(tableLog_tooLarge): return "tableLog requires too much memory : unsupported";
    case PREFIX(maxSymbolValue_tooLarge): return "Unsupported max Symbol Value : too large";
    case PREFIX(maxSymbolValue_tooSmall): return "Specified maxSymbolValue is too small";
    case PREFIX(dictionary_corrupted): return "Dictionary is corrupted";
    case PREFIX(dictionary_wrong): return "Dictionary mismatch";
    case PREFIX(dictionaryCreation_failed): return "Cannot create Dictionary from provided samples";
    case PREFIX(dstSize_tooSmall): return "Destination buffer is too small";
    case PREFIX(srcSize_wrong): return "Src size is incorrect";
    case PREFIX(dstBuffer_null): return "Operation on NULL destination buffer";
        /* following error codes are not stable and may be removed or changed in a future version */
    case PREFIX(frameIndex_tooLarge): return "Frame index is too large";
    case PREFIX(seekableIO): return "An I/O error occurred when reading/seeking";
    case PREFIX(maxCode):
    default: return notErrorCode;
    }
#endif
}